

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_steal(void)

{
  long lVar1;
  char cVar2;
  undefined8 uVar3;
  bson_t *b;
  char *pcVar4;
  uint8_t *buf;
  bson_t dst;
  size_t len;
  bson_t stack_alloced;
  undefined4 *local_288;
  uint local_280 [12];
  long local_250;
  code *local_240;
  long local_238;
  undefined8 local_188;
  bson_t local_180 [2];
  
  bson_init(local_180);
  bson_append_int32(local_180,"a",1);
  cVar2 = bson_steal(local_280,local_180);
  if (cVar2 == '\0') {
    pcVar4 = "bson_steal (&dst, &stack_alloced)";
    uVar3 = 0x712;
  }
  else {
    cVar2 = bson_has_field(local_280,"a");
    if (cVar2 == '\0') {
      pcVar4 = "bson_has_field (&dst, \"a\")";
      uVar3 = 0x713;
    }
    else if ((local_280[0] & 1) == 0) {
      pcVar4 = "dst.flags & BSON_FLAG_INLINE";
      uVar3 = 0x714;
    }
    else {
      cVar2 = bson_validate(local_180,0,0);
      if (cVar2 == '\0') {
        bson_destroy(local_280);
        bson_init(local_180);
        bloat(local_180);
        cVar2 = bson_steal(local_280,local_180);
        if (cVar2 == '\0') {
          pcVar4 = "bson_steal (&dst, &stack_alloced)";
          uVar3 = 0x71d;
        }
        else if (local_180[0].padding._40_8_ == local_250) {
          cVar2 = bson_has_field(local_280,"99");
          if (cVar2 == '\0') {
            pcVar4 = "bson_has_field (&dst, \"99\")";
            uVar3 = 0x720;
          }
          else if ((local_280[0] & 1) == 0) {
            cVar2 = bson_validate(local_180,0,0);
            if (cVar2 == '\0') {
              bson_destroy(local_280);
              uVar3 = bson_new();
              bson_append_int32(uVar3,"a",1);
              cVar2 = bson_steal(local_280,uVar3);
              if (cVar2 == '\0') {
                pcVar4 = "bson_steal (&dst, heap_alloced)";
                uVar3 = 0x728;
              }
              else {
                cVar2 = bson_has_field(local_280,"a");
                if (cVar2 == '\0') {
                  pcVar4 = "bson_has_field (&dst, \"a\")";
                  uVar3 = 0x729;
                }
                else if ((local_280[0] & 1) == 0) {
                  pcVar4 = "dst.flags & BSON_FLAG_INLINE";
                  uVar3 = 0x72a;
                }
                else {
                  bson_destroy(local_280);
                  b = (bson_t *)bson_new();
                  bloat(b);
                  lVar1 = *(long *)(b->padding + 0x28);
                  cVar2 = bson_steal(local_280,b);
                  if (cVar2 == '\0') {
                    pcVar4 = "bson_steal (&dst, heap_alloced)";
                    uVar3 = 0x731;
                  }
                  else if (lVar1 == local_250) {
                    cVar2 = bson_has_field(local_280,"99");
                    if (cVar2 == '\0') {
                      pcVar4 = "bson_has_field (&dst, \"99\")";
                      uVar3 = 0x734;
                    }
                    else if ((local_280[0] & 1) == 0) {
                      bson_destroy(local_280);
                      local_288 = (undefined4 *)bson_malloc0(5);
                      local_188 = 5;
                      *local_288 = 5;
                      uVar3 = bson_new_from_buffer(&local_288,&local_188,bson_realloc_ctx,0);
                      cVar2 = bson_steal(local_280,uVar3);
                      if (cVar2 == '\0') {
                        pcVar4 = "bson_steal (&dst, heap_alloced)";
                        uVar3 = 0x73e;
                      }
                      else if ((local_280[0] & 0x20) == 0) {
                        pcVar4 = "dst.flags & BSON_FLAG_NO_FREE";
                        uVar3 = 0x73f;
                      }
                      else if ((local_280[0] & 2) == 0) {
                        pcVar4 = "dst.flags & BSON_FLAG_STATIC";
                        uVar3 = 0x740;
                      }
                      else if (local_240 == bson_realloc_ctx) {
                        if (local_238 == 0) {
                          bson_destroy(local_280);
                          bson_free(local_288);
                          return;
                        }
                        pcVar4 = "((bson_impl_alloc_t *) &dst)->realloc_func_ctx == NULL";
                        uVar3 = 0x742;
                      }
                      else {
                        pcVar4 = "((bson_impl_alloc_t *) &dst)->realloc == bson_realloc_ctx";
                        uVar3 = 0x741;
                      }
                    }
                    else {
                      pcVar4 = "!(dst.flags & BSON_FLAG_INLINE)";
                      uVar3 = 0x735;
                    }
                  }
                  else {
                    pcVar4 = "alloc == ((bson_impl_alloc_t *) &dst)->alloc";
                    uVar3 = 0x733;
                  }
                }
              }
            }
            else {
              pcVar4 = "!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0)";
              uVar3 = 0x722;
            }
          }
          else {
            pcVar4 = "!(dst.flags & BSON_FLAG_INLINE)";
            uVar3 = 0x721;
          }
        }
        else {
          pcVar4 = "alloc == ((bson_impl_alloc_t *) &dst)->alloc";
          uVar3 = 0x71f;
        }
      }
      else {
        pcVar4 = "!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0)";
        uVar3 = 0x716;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          uVar3,"test_bson_steal",pcVar4);
  abort();
}

Assistant:

static void
test_bson_steal (void)
{
   bson_t stack_alloced;
   bson_t *heap_alloced;
   bson_t dst;
   uint8_t *alloc;
   uint8_t *buf;
   size_t len;
   uint32_t len_le;

   /* inline, stack-allocated */
   bson_init (&stack_alloced);
   BSON_APPEND_INT32 (&stack_alloced, "a", 1);
   ASSERT (bson_steal (&dst, &stack_alloced));
   ASSERT (bson_has_field (&dst, "a"));
   ASSERT (dst.flags & BSON_FLAG_INLINE);
   /* src was invalidated */
   ASSERT (!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0));
   bson_destroy (&dst);

   /* spilled over, stack-allocated */
   bson_init (&stack_alloced);
   bloat (&stack_alloced);
   alloc = ((bson_impl_alloc_t *) &stack_alloced)->alloc;
   ASSERT (bson_steal (&dst, &stack_alloced));
   /* data was transferred */
   ASSERT (alloc == ((bson_impl_alloc_t *) &dst)->alloc);
   ASSERT (bson_has_field (&dst, "99"));
   ASSERT (!(dst.flags & BSON_FLAG_INLINE));
   ASSERT (!bson_validate (&stack_alloced, BSON_VALIDATE_NONE, 0));
   bson_destroy (&dst);

   /* inline, heap-allocated */
   heap_alloced = bson_new ();
   BSON_APPEND_INT32 (heap_alloced, "a", 1);
   ASSERT (bson_steal (&dst, heap_alloced));
   ASSERT (bson_has_field (&dst, "a"));
   ASSERT (dst.flags & BSON_FLAG_INLINE);
   bson_destroy (&dst);

   /* spilled over, heap-allocated */
   heap_alloced = bson_new ();
   bloat (heap_alloced);
   alloc = ((bson_impl_alloc_t *) heap_alloced)->alloc;
   ASSERT (bson_steal (&dst, heap_alloced));
   /* data was transferred */
   ASSERT (alloc == ((bson_impl_alloc_t *) &dst)->alloc);
   ASSERT (bson_has_field (&dst, "99"));
   ASSERT (!(dst.flags & BSON_FLAG_INLINE));
   bson_destroy (&dst);

   /* test stealing from a bson created with bson_new_from_buffer */
   buf = bson_malloc0 (5);
   len = 5;
   len_le = BSON_UINT32_TO_LE (5);
   memcpy (buf, &len_le, sizeof (len_le));
   heap_alloced = bson_new_from_buffer (&buf, &len, bson_realloc_ctx, NULL);
   ASSERT (bson_steal (&dst, heap_alloced));
   ASSERT (dst.flags & BSON_FLAG_NO_FREE);
   ASSERT (dst.flags & BSON_FLAG_STATIC);
   ASSERT (((bson_impl_alloc_t *) &dst)->realloc == bson_realloc_ctx);
   ASSERT (((bson_impl_alloc_t *) &dst)->realloc_func_ctx == NULL);
   bson_destroy (&dst);
   bson_free (buf);
}